

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepScanLineBasic.cpp
# Opt level: O1

void anon_unknown.dwarf_10e49f::readFile
               (string *filename,int channelCount,bool bulkRead,bool randomChannels)

{
  float fVar1;
  LineOrder LVar2;
  Compression CVar3;
  PixelType PVar4;
  size_t __n;
  ulong __n_00;
  PixelType t;
  Array2D<void_*> *pAVar5;
  bool bVar6;
  uint uVar7;
  Header *this;
  Box2i *pBVar8;
  Box2i *pBVar9;
  float *pfVar10;
  V2f *pVVar11;
  V2f *pVVar12;
  LineOrder *pLVar13;
  Compression *pCVar14;
  ChannelList *this_00;
  ChannelList *other;
  string *psVar15;
  string *psVar16;
  void *pvVar17;
  void *pvVar18;
  ostream *poVar19;
  long *plVar20;
  int iVar21;
  undefined7 in_register_00000009;
  long lVar22;
  long lVar23;
  int k;
  ulong uVar24;
  int k_2;
  uint uVar25;
  char *pcVar26;
  long lVar27;
  uint uVar28;
  void *pvVar29;
  uint uVar30;
  size_t spst;
  undefined1 in_R10B;
  int k_1;
  int j;
  long lVar31;
  int j_1;
  ulong uVar32;
  float fVar33;
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int iVar39;
  int iVar40;
  Array<Imf_2_5::Array2D<void_*>_> data;
  DeepScanLineInputFile file;
  string str;
  vector<int,_std::allocator<int>_> read_channel;
  DeepFrameBuffer frameBuffer;
  stringstream ss;
  undefined1 local_1e0 [112];
  ios_base local_170 [264];
  DeepSlice local_68;
  
  __n_00 = (ulong)(uint)channelCount;
  iVar21 = (int)CONCAT71(in_register_00000009,randomChannels);
  if (iVar21 == 0) {
    pcVar26 = " reading all channels ";
    lVar23 = 0x16;
  }
  else {
    pcVar26 = " reading random channels ";
    lVar23 = 0x19;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar26,lVar23);
  std::ostream::flush();
  Imf_2_5::DeepScanLineInputFile::DeepScanLineInputFile(&file,(filename->_M_dataplus)._M_p,8);
  this = Imf_2_5::DeepScanLineInputFile::header(&file);
  pBVar8 = Imf_2_5::Header::displayWindow(this);
  pBVar9 = Imf_2_5::Header::displayWindow((Header *)(anonymous_namespace)::header);
  iVar39 = -(uint)((pBVar9->min).x == (pBVar8->min).x);
  iVar40 = -(uint)((pBVar9->min).y == (pBVar8->min).y);
  auVar35._4_4_ = iVar39;
  auVar35._0_4_ = iVar39;
  auVar35._8_4_ = iVar40;
  auVar35._12_4_ = iVar40;
  iVar21 = movmskpd(iVar21,auVar35);
  if ((iVar21 != 3) ||
     (iVar39 = -(uint)((pBVar9->max).x == (pBVar8->max).x),
     iVar40 = -(uint)((pBVar9->max).y == (pBVar8->max).y), auVar36._4_4_ = iVar39,
     auVar36._0_4_ = iVar39, auVar36._8_4_ = iVar40, auVar36._12_4_ = iVar40,
     iVar39 = movmskpd((int)pBVar9,auVar36), iVar39 != 3)) {
    __assert_fail("fileHeader.displayWindow() == header.displayWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                  ,0x10a,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  pBVar8 = Imf_2_5::Header::dataWindow(this);
  pBVar9 = Imf_2_5::Header::dataWindow((Header *)(anonymous_namespace)::header);
  iVar39 = -(uint)((pBVar9->min).x == (pBVar8->min).x);
  iVar40 = -(uint)((pBVar9->min).y == (pBVar8->min).y);
  auVar37._4_4_ = iVar39;
  auVar37._0_4_ = iVar39;
  auVar37._8_4_ = iVar40;
  auVar37._12_4_ = iVar40;
  iVar21 = movmskpd(iVar21,auVar37);
  if ((iVar21 != 3) ||
     (iVar21 = -(uint)((pBVar9->max).x == (pBVar8->max).x),
     iVar39 = -(uint)((pBVar9->max).y == (pBVar8->max).y), auVar38._4_4_ = iVar21,
     auVar38._0_4_ = iVar21, auVar38._8_4_ = iVar39, auVar38._12_4_ = iVar39,
     iVar21 = movmskpd((int)pBVar9,auVar38), iVar21 != 3)) {
    __assert_fail("fileHeader.dataWindow() == header.dataWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                  ,0x10b,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  pfVar10 = Imf_2_5::Header::pixelAspectRatio(this);
  fVar33 = *pfVar10;
  pfVar10 = Imf_2_5::Header::pixelAspectRatio((Header *)(anonymous_namespace)::header);
  if ((fVar33 != *pfVar10) || (NAN(fVar33) || NAN(*pfVar10))) {
    __assert_fail("fileHeader.pixelAspectRatio() == header.pixelAspectRatio()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                  ,0x10c,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  pVVar11 = Imf_2_5::Header::screenWindowCenter(this);
  pVVar12 = Imf_2_5::Header::screenWindowCenter((Header *)(anonymous_namespace)::header);
  if ((((pVVar11->x != pVVar12->x) || (NAN(pVVar11->x) || NAN(pVVar12->x))) ||
      (pVVar11->y != pVVar12->y)) || (NAN(pVVar11->y) || NAN(pVVar12->y))) {
    __assert_fail("fileHeader.screenWindowCenter() == header.screenWindowCenter()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                  ,0x10d,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  pfVar10 = Imf_2_5::Header::screenWindowWidth(this);
  fVar33 = *pfVar10;
  pfVar10 = Imf_2_5::Header::screenWindowWidth((Header *)(anonymous_namespace)::header);
  if ((fVar33 != *pfVar10) || (NAN(fVar33) || NAN(*pfVar10))) {
    __assert_fail("fileHeader.screenWindowWidth() == header.screenWindowWidth()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                  ,0x10e,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  pLVar13 = Imf_2_5::Header::lineOrder(this);
  LVar2 = *pLVar13;
  pLVar13 = Imf_2_5::Header::lineOrder((Header *)(anonymous_namespace)::header);
  if (LVar2 != *pLVar13) {
    __assert_fail("fileHeader.lineOrder() == header.lineOrder()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                  ,0x10f,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  pCVar14 = Imf_2_5::Header::compression(this);
  CVar3 = *pCVar14;
  pCVar14 = Imf_2_5::Header::compression((Header *)(anonymous_namespace)::header);
  if (CVar3 != *pCVar14) {
    __assert_fail("fileHeader.compression() == header.compression()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                  ,0x110,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  this_00 = Imf_2_5::Header::channels(this);
  other = Imf_2_5::Header::channels((Header *)(anonymous_namespace)::header);
  bVar6 = Imf_2_5::ChannelList::operator==(this_00,other);
  if (!bVar6) {
    __assert_fail("fileHeader.channels() == header.channels()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                  ,0x111,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  psVar15 = Imf_2_5::Header::type_abi_cxx11_(this);
  psVar16 = Imf_2_5::Header::type_abi_cxx11_((Header *)(anonymous_namespace)::header);
  __n = psVar15->_M_string_length;
  if ((__n != psVar16->_M_string_length) ||
     ((__n != 0 &&
      (iVar21 = bcmp((psVar15->_M_dataplus)._M_p,(psVar16->_M_dataplus)._M_p,__n), iVar21 != 0)))) {
    __assert_fail("fileHeader.type() == header.type()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                  ,0x112,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  pvVar17 = operator_new__(0x2e1f4);
  uVar7 = random_int(3);
  uVar25 = uVar7 + channelCount;
  Imf_2_5::Array<Imf_2_5::Array2D<void_*>_>::Array(&data,(long)(int)uVar25);
  if (0 < (int)uVar25) {
    lVar23 = 0;
    do {
      pAVar5 = data._data;
      pvVar18 = operator_new__(0x5c3e8);
      pvVar29 = *(void **)((long)&pAVar5->_data + lVar23);
      if (pvVar29 != (void *)0x0) {
        operator_delete__(pvVar29);
      }
      *(undefined8 *)((long)&pAVar5->_sizeX + lVar23) = 0xad;
      *(undefined8 *)((long)&pAVar5->_sizeY + lVar23) = 0x111;
      *(void **)((long)&pAVar5->_data + lVar23) = pvVar18;
      lVar23 = lVar23 + 0x18;
    } while ((ulong)uVar25 * 0x18 != lVar23);
  }
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_2_5::Slice::Slice
            (&frameBuffer._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,(bool)in_R10B,
             SUB81(frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0));
  Imf_2_5::Slice::Slice
            ((Slice *)&ss,UINT,
             (char *)((long)pvVar17 +
                     (long)(int)DAT_0043e3d4 * -0x444 + (long)(anonymous_namespace)::dataWindow * -4
                     ),4,0x444,1,1,0.0,(bool)in_R10B,(bool)((char)DAT_0043e3d4 * 'D'));
  Imf_2_5::DeepFrameBuffer::insertSampleCountSlice(&frameBuffer,(Slice *)&ss);
  std::vector<int,_std::allocator<int>_>::vector(&read_channel,__n_00,(allocator_type *)&ss);
  if (0 < channelCount) {
    lVar23 = 0x10;
    uVar32 = 0;
    iVar21 = 0;
    do {
      if (randomChannels) {
        iVar39 = random_int(2);
        read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar32] = iVar39;
        if (!randomChannels || iVar39 == 1) goto LAB_00144505;
      }
      else {
LAB_00144505:
        PVar4 = *(PixelType *)((anonymous_namespace)::channelTypes + uVar32 * 4);
        t = (uint)(PVar4 != UINT) * 3;
        if (PVar4 == HALF) {
          t = PVar4;
        }
        if (PVar4 == FLOAT) {
          t = PVar4;
        }
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        std::ostream::operator<<(local_1e0,(int)uVar32);
        std::__cxx11::stringbuf::str();
        iVar39 = *(int *)((anonymous_namespace)::channelTypes + uVar32 * 4);
        spst = (ulong)(iVar39 == 0) << 2;
        if (iVar39 == 1) {
          spst = 2;
        }
        if (iVar39 == 2) {
          spst = 4;
        }
        Imf_2_5::DeepSlice::DeepSlice
                  (&local_68,t,
                   (char *)(*(long *)((long)&(data._data)->_sizeX + lVar23) +
                            (long)(anonymous_namespace)::dataWindow * -8 +
                           (long)(int)DAT_0043e3d4 * -0x888),8,0x888,spst,1,1,0.0,false,false);
        Imf_2_5::DeepFrameBuffer::insert(&frameBuffer,&str,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)str._M_dataplus._M_p != &str.field_2) {
          operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
        }
        iVar21 = iVar21 + 1;
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        std::ios_base::~ios_base(local_170);
      }
      uVar32 = uVar32 + 1;
      lVar23 = lVar23 + 0x18;
    } while (__n_00 != uVar32);
    if (iVar21 != 0) {
      if (0 < (int)uVar7) {
        lVar23 = __n_00 * 0x18;
        uVar32 = 0;
        do {
          std::__cxx11::stringstream::stringstream((stringstream *)&ss);
          poVar19 = (ostream *)std::ostream::operator<<(local_1e0,(int)uVar32);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,"fill",4);
          std::__cxx11::stringbuf::str();
          Imf_2_5::DeepSlice::DeepSlice
                    (&local_68,FLOAT,
                     (char *)(*(long *)((long)&(data._data)->_data + lVar23) +
                              (long)(anonymous_namespace)::dataWindow * -8 +
                             (long)(int)DAT_0043e3d4 * -0x888),8,0x888,4,1,1,0.0,false,false);
          Imf_2_5::DeepFrameBuffer::insert(&frameBuffer,&str,&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)str._M_dataplus._M_p != &str.field_2) {
            operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
          std::ios_base::~ios_base(local_170);
          uVar32 = uVar32 + 1;
          lVar23 = lVar23 + 0x18;
        } while (uVar7 != uVar32);
      }
      Imf_2_5::DeepScanLineInputFile::setFrameBuffer(&file,&frameBuffer);
      if (bulkRead) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"bulk ",5);
        std::ostream::flush();
        Imf_2_5::DeepScanLineInputFile::readPixelSampleCounts(&file,DAT_0043e3d4,DAT_0043e3dc);
        iVar21 = DAT_0043e3dc;
        uVar25 = DAT_0043e3d4;
        iVar39 = DAT_0043e3dc - DAT_0043e3d4;
        if ((int)DAT_0043e3d4 <= DAT_0043e3dc) {
          lVar23 = (anonymous_namespace)::sampleCount._8_8_ * 4;
          lVar27 = 0;
          uVar32 = 0;
          pvVar29 = pvVar17;
          do {
            lVar22 = 0;
            do {
              if (*(int *)((long)pvVar29 + lVar22 * 4) !=
                  *(int *)((anonymous_namespace)::sampleCount._16_8_ + lVar27 + lVar22 * 4)) {
                __assert_fail("localSampleCount[i][j] == sampleCount[i][j]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                              ,0x176,
                              "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                             );
              }
              lVar22 = lVar22 + 1;
            } while (lVar22 != 0x111);
            lVar22 = 0;
            do {
              lVar31 = 4;
              uVar24 = 0;
              do {
                if ((!randomChannels) ||
                   (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar24] == 1)) {
                  if (*(int *)((anonymous_namespace)::channelTypes + uVar24 * 4) == 0) {
                    pvVar18 = operator_new__((ulong)*(uint *)((long)pvVar17 +
                                                             lVar22 * 4 + uVar32 * 0x444) << 2);
                    *(void **)(*(long *)((long)data._data + lVar31 * 4 + -8) * uVar32 * 8 +
                               *(long *)((long)&(data._data)->_sizeX + lVar31 * 4) + lVar22 * 8) =
                         pvVar18;
                  }
                  if (*(int *)((anonymous_namespace)::channelTypes + uVar24 * 4) == 1) {
                    pvVar18 = operator_new__((ulong)*(uint *)((long)pvVar17 +
                                                             lVar22 * 4 + uVar32 * 0x444) * 2);
                    *(void **)(*(long *)((long)data._data + lVar31 * 4 + -8) * uVar32 * 8 +
                               *(long *)((long)&(data._data)->_sizeX + lVar31 * 4) + lVar22 * 8) =
                         pvVar18;
                  }
                  if (*(int *)((anonymous_namespace)::channelTypes + uVar24 * 4) == 2) {
                    pvVar18 = operator_new__((ulong)*(uint *)((long)pvVar17 +
                                                             lVar22 * 4 + uVar32 * 0x444) << 2);
                    *(void **)(*(long *)((long)data._data + lVar31 * 4 + -8) * uVar32 * 8 +
                               *(long *)((long)&(data._data)->_sizeX + lVar31 * 4) + lVar22 * 8) =
                         pvVar18;
                  }
                }
                uVar24 = uVar24 + 1;
                lVar31 = lVar31 + 6;
              } while (__n_00 != uVar24);
              if (0 < (int)uVar7) {
                uVar28 = *(uint *)((long)pvVar17 + lVar22 * 4 + uVar32 * 0x444);
                uVar24 = (ulong)uVar7;
                lVar31 = __n_00 * 0x18 + 0x10;
                do {
                  pvVar18 = operator_new__((ulong)uVar28 << 2);
                  *(void **)(*(long *)((long)data._data + lVar31 + -8) * uVar32 * 8 +
                             *(long *)((long)&(data._data)->_sizeX + lVar31) + lVar22 * 8) = pvVar18
                  ;
                  lVar31 = lVar31 + 0x18;
                  uVar24 = uVar24 - 1;
                } while (uVar24 != 0);
              }
              lVar22 = lVar22 + 1;
            } while (lVar22 != 0x111);
            uVar32 = uVar32 + 1;
            lVar27 = lVar27 + lVar23;
            pvVar29 = (void *)((long)pvVar29 + 0x444);
          } while (uVar32 != iVar39 + 1);
        }
        Imf_2_5::DeepScanLineInputFile::readPixels(&file,uVar25,iVar21);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"per-line ",9);
        std::ostream::flush();
        uVar32 = (ulong)DAT_0043e3d4;
        if ((int)DAT_0043e3d4 <= DAT_0043e3dc) {
          lVar27 = 0;
          lVar23 = 0;
          pvVar29 = pvVar17;
          do {
            iVar21 = (int)uVar32 + (int)lVar23;
            Imf_2_5::DeepScanLineInputFile::readPixelSampleCounts(&file,iVar21);
            lVar22 = 0;
            do {
              if (*(int *)((long)pvVar29 + lVar22 * 4) !=
                  *(int *)((anonymous_namespace)::sampleCount._8_8_ * lVar27 +
                           (anonymous_namespace)::sampleCount._16_8_ + lVar22 * 4)) {
                __assert_fail("localSampleCount[i][j] == sampleCount[i][j]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                              ,0x199,
                              "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                             );
              }
              lVar22 = lVar22 + 1;
            } while (lVar22 != 0x111);
            lVar22 = 0;
            do {
              lVar31 = 4;
              uVar32 = 0;
              do {
                if ((!randomChannels) ||
                   (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar32] == 1)) {
                  if (*(int *)((anonymous_namespace)::channelTypes + uVar32 * 4) == 0) {
                    pvVar18 = operator_new__((ulong)*(uint *)((long)pvVar17 +
                                                             lVar22 * 4 + lVar23 * 0x444) << 2);
                    *(void **)(*(long *)((long)data._data + lVar31 * 4 + -8) * lVar23 * 8 +
                               *(long *)((long)&(data._data)->_sizeX + lVar31 * 4) + lVar22 * 8) =
                         pvVar18;
                  }
                  if (*(int *)((anonymous_namespace)::channelTypes + uVar32 * 4) == 1) {
                    pvVar18 = operator_new__((ulong)*(uint *)((long)pvVar17 +
                                                             lVar22 * 4 + lVar23 * 0x444) * 2);
                    *(void **)(*(long *)((long)data._data + lVar31 * 4 + -8) * lVar23 * 8 +
                               *(long *)((long)&(data._data)->_sizeX + lVar31 * 4) + lVar22 * 8) =
                         pvVar18;
                  }
                  if (*(int *)((anonymous_namespace)::channelTypes + uVar32 * 4) == 2) {
                    pvVar18 = operator_new__((ulong)*(uint *)((long)pvVar17 +
                                                             lVar22 * 4 + lVar23 * 0x444) << 2);
                    *(void **)(*(long *)((long)data._data + lVar31 * 4 + -8) * lVar23 * 8 +
                               *(long *)((long)&(data._data)->_sizeX + lVar31 * 4) + lVar22 * 8) =
                         pvVar18;
                  }
                }
                uVar32 = uVar32 + 1;
                lVar31 = lVar31 + 6;
              } while (__n_00 != uVar32);
              if (0 < (int)uVar7) {
                uVar25 = *(uint *)((long)pvVar17 + lVar22 * 4 + lVar23 * 0x444);
                lVar31 = __n_00 * 0x18 + 0x10;
                uVar32 = (ulong)uVar7;
                do {
                  pvVar18 = operator_new__((ulong)uVar25 << 2);
                  *(void **)(*(long *)((long)data._data + lVar31 + -8) * lVar23 * 8 +
                             *(long *)((long)&(data._data)->_sizeX + lVar31) + lVar22 * 8) = pvVar18
                  ;
                  lVar31 = lVar31 + 0x18;
                  uVar32 = uVar32 - 1;
                } while (uVar32 != 0);
              }
              lVar22 = lVar22 + 1;
            } while (lVar22 != 0x111);
            Imf_2_5::DeepScanLineInputFile::readPixels(&file,iVar21);
            uVar32 = (ulong)(int)DAT_0043e3d4;
            lVar27 = lVar27 + 4;
            pvVar29 = (void *)((long)pvVar29 + 0x444);
            bVar6 = lVar23 < (long)((long)DAT_0043e3dc - uVar32);
            lVar23 = lVar23 + 1;
          } while (bVar6);
        }
      }
      lVar23 = 0;
      do {
        iVar39 = (int)lVar23;
        iVar21 = iVar39 * 0x111;
        lVar27 = 0;
        do {
          iVar40 = (int)lVar27;
          uVar30 = (uint)(iVar40 + iVar21) % 0x801;
          fVar33 = (float)uVar30;
          uVar28 = (uint)(iVar40 + iVar21) % 0x801;
          uVar25 = (uint)(iVar40 + iVar21) % 0x801;
          fVar34 = (float)uVar25;
          uVar32 = 0;
          do {
            if (((!randomChannels) ||
                (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar32] == 1)) &&
               (*(int *)((anonymous_namespace)::sampleCount._8_8_ * lVar23 * 4 +
                         (anonymous_namespace)::sampleCount._16_8_ + lVar27 * 4) != 0)) {
              uVar24 = 0;
              do {
                if (*(int *)((anonymous_namespace)::channelTypes + uVar32 * 4) == 0) {
                  pvVar29 = data._data[uVar32]._data[data._data[uVar32]._sizeY * lVar23 + lVar27];
                  if (*(uint *)((long)pvVar29 + uVar24 * 4) != uVar28) {
                    poVar19 = (ostream *)std::ostream::operator<<(&std::cout,iVar40);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
                    poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar39);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar19," error, should be ",0x12);
                    poVar19 = (ostream *)std::ostream::operator<<(poVar19,uVar28);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar19,", is ",5);
                    poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19)
                    ;
                    std::ostream::put((char)poVar19);
                    std::ostream::flush();
                    std::ostream::flush();
                  }
                  if (*(uint *)((long)pvVar29 + uVar24 * 4) != uVar28) {
                    __assert_fail("value[l] == static_cast<unsigned int>(i * width + j) % 2049",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                                  ,0x1c3,
                                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                                 );
                  }
                }
                if (*(int *)((anonymous_namespace)::channelTypes + uVar32 * 4) == 1) {
                  pvVar29 = data._data[uVar32]._data[data._data[uVar32]._sizeY * lVar23 + lVar27];
                  fVar1 = *(float *)((long)&half::_toFloat +
                                    (ulong)*(ushort *)((long)pvVar29 + uVar24 * 2) * 4);
                  if ((fVar1 != fVar33) || (NAN(fVar1) || NAN(fVar33))) {
                    poVar19 = (ostream *)std::ostream::operator<<(&std::cout,iVar40);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
                    poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar39);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar19," error, should be ",0x12);
                    poVar19 = (ostream *)std::ostream::operator<<(poVar19,uVar30);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar19,", is ",5);
                    plVar20 = (long *)operator<<(poVar19,(half)*(unsigned_short *)
                                                                ((long)pvVar29 + uVar24 * 2));
                    std::ios::widen((char)*(undefined8 *)(*plVar20 + -0x18) + (char)plVar20);
                    std::ostream::put((char)plVar20);
                    std::ostream::flush();
                    std::ostream::flush();
                  }
                  fVar1 = *(float *)((long)&half::_toFloat +
                                    (ulong)*(ushort *)
                                            ((long)data._data[uVar32]._data
                                                   [data._data[uVar32]._sizeY * lVar23 + lVar27] +
                                            uVar24 * 2) * 4);
                  if ((fVar1 != fVar33) || (NAN(fVar1) || NAN(fVar33))) {
                    __assert_fail("((half*)(data[k][i][j]))[l] == (i * width + j) % 2049",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                                  ,0x1cc,
                                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                                 );
                  }
                }
                if (*(int *)((anonymous_namespace)::channelTypes + uVar32 * 4) == 2) {
                  pvVar29 = data._data[uVar32]._data[data._data[uVar32]._sizeY * lVar23 + lVar27];
                  fVar1 = *(float *)((long)pvVar29 + uVar24 * 4);
                  if ((fVar1 != fVar34) || (NAN(fVar1) || NAN(fVar34))) {
                    poVar19 = (ostream *)std::ostream::operator<<(&std::cout,iVar40);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
                    poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar39);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar19," error, should be ",0x12);
                    poVar19 = (ostream *)std::ostream::operator<<(poVar19,uVar25);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar19,", is ",5);
                    poVar19 = std::ostream::_M_insert<double>
                                        ((double)*(float *)((long)pvVar29 + uVar24 * 4));
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19)
                    ;
                    std::ostream::put((char)poVar19);
                    std::ostream::flush();
                    std::ostream::flush();
                  }
                  fVar1 = *(float *)((long)data._data[uVar32]._data
                                           [data._data[uVar32]._sizeY * lVar23 + lVar27] +
                                    uVar24 * 4);
                  if ((fVar1 != fVar34) || (NAN(fVar1) || NAN(fVar34))) {
                    __assert_fail("((float*)(data[k][i][j]))[l] == (i * width + j) % 2049",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                                  ,0x1d5,
                                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                                 );
                  }
                }
                uVar24 = uVar24 + 1;
              } while (uVar24 < *(uint *)((anonymous_namespace)::sampleCount._8_8_ * lVar23 * 4 +
                                          (anonymous_namespace)::sampleCount._16_8_ + lVar27 * 4));
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != __n_00);
          lVar27 = lVar27 + 1;
        } while (lVar27 != 0x111);
        lVar23 = lVar23 + 1;
      } while (lVar23 != 0xad);
      lVar23 = 0;
      do {
        lVar27 = 0;
        do {
          lVar22 = 4;
          uVar32 = 0;
          do {
            if ((!randomChannels) ||
               (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar32] == 1)) {
              if ((*(int *)((anonymous_namespace)::channelTypes + uVar32 * 4) == 0) &&
                 (pvVar29 = *(void **)(*(long *)((long)data._data + lVar22 * 4 + -8) * lVar23 * 8 +
                                       *(long *)((long)&(data._data)->_sizeX + lVar22 * 4) +
                                      lVar27 * 8), pvVar29 != (void *)0x0)) {
                operator_delete__(pvVar29);
              }
              if ((*(int *)((anonymous_namespace)::channelTypes + uVar32 * 4) == 1) &&
                 (pvVar29 = *(void **)(*(long *)((long)data._data + lVar22 * 4 + -8) * lVar23 * 8 +
                                       *(long *)((long)&(data._data)->_sizeX + lVar22 * 4) +
                                      lVar27 * 8), pvVar29 != (void *)0x0)) {
                operator_delete__(pvVar29);
              }
              if ((*(int *)((anonymous_namespace)::channelTypes + uVar32 * 4) == 2) &&
                 (pvVar29 = *(void **)(*(long *)((long)data._data + lVar22 * 4 + -8) * lVar23 * 8 +
                                       *(long *)((long)&(data._data)->_sizeX + lVar22 * 4) +
                                      lVar27 * 8), pvVar29 != (void *)0x0)) {
                operator_delete__(pvVar29);
              }
            }
            uVar32 = uVar32 + 1;
            lVar22 = lVar22 + 6;
          } while (__n_00 != uVar32);
          lVar22 = __n_00 * 0x18 + 0x10;
          uVar32 = (ulong)uVar7;
          if (0 < (int)uVar7) {
            do {
              pvVar29 = *(void **)(*(long *)((long)data._data + lVar22 + -8) * lVar23 * 8 +
                                   *(long *)((long)&(data._data)->_sizeX + lVar22) + lVar27 * 8);
              if (pvVar29 != (void *)0x0) {
                operator_delete__(pvVar29);
              }
              lVar22 = lVar22 + 0x18;
              uVar32 = uVar32 - 1;
            } while (uVar32 != 0);
          }
          lVar27 = lVar27 + 1;
        } while (lVar27 != 0x111);
        lVar23 = lVar23 + 1;
      } while (lVar23 != 0xad);
      goto LAB_00144a15;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"skipping ",9);
  std::ostream::flush();
LAB_00144a15:
  if (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
               *)&frameBuffer);
  Imf_2_5::Array<Imf_2_5::Array2D<void_*>_>::~Array(&data);
  operator_delete__(pvVar17);
  Imf_2_5::DeepScanLineInputFile::~DeepScanLineInputFile(&file);
  return;
}

Assistant:

void readFile (const std::string & filename,
               int channelCount,
               bool bulkRead,
               bool randomChannels)
{
    if(randomChannels)
    {
      cout << " reading random channels " << flush;
    }
    else
    {
      cout << " reading all channels " << flush;
    }
    
    DeepScanLineInputFile file(filename.c_str(), 8);

    const Header& fileHeader = file.header();
    assert (fileHeader.displayWindow() == header.displayWindow());
    assert (fileHeader.dataWindow() == header.dataWindow());
    assert (fileHeader.pixelAspectRatio() == header.pixelAspectRatio());
    assert (fileHeader.screenWindowCenter() == header.screenWindowCenter());
    assert (fileHeader.screenWindowWidth() == header.screenWindowWidth());
    assert (fileHeader.lineOrder() == header.lineOrder());
    assert (fileHeader.compression() == header.compression());
    assert (fileHeader.channels() == header.channels());
    assert (fileHeader.type() == header.type());

    Array2D<unsigned int> localSampleCount;
    localSampleCount.resizeErase(height, width);
    
        
    // also test filling channels. Generate up to 2 extra channels
    int fillChannels=random_int(3);
    
    Array<Array2D< void* > > data(channelCount+fillChannels);
    for (int i = 0; i < channelCount+fillChannels; i++)
        data[i].resizeErase(height, width);

    DeepFrameBuffer frameBuffer;

    frameBuffer.insertSampleCountSlice (Slice (IMF::UINT,                    // type // 7
                                        (char *) (&localSampleCount[0][0]
                                                  - dataWindow.min.x
                                                  - dataWindow.min.y * width),               // base // 8)
                                        sizeof (unsigned int) * 1,          // xStride// 9
                                        sizeof (unsigned int) * width));    // yStride// 10

    vector<int> read_channel(channelCount);
    
    
    int channels_added=0;
    
    for (int i = 0; i < channelCount; i++)
    {
        if(randomChannels)
        {
	     read_channel[i] = random_int(2);
	     
        }
        if(!randomChannels || read_channel[i]==1)
	{
            PixelType type = NUM_PIXELTYPES;
            if (channelTypes[i] == 0)
                type = IMF::UINT;
            if (channelTypes[i] == 1)
                type = IMF::HALF;
            if (channelTypes[i] == 2)
                type = IMF::FLOAT;

            stringstream ss;
            ss << i;
            string str = ss.str();

            int sampleSize = 0;
            if (channelTypes[i] == 0) sampleSize = sizeof (unsigned int);
            if (channelTypes[i] == 1) sampleSize = sizeof (half);
            if (channelTypes[i] == 2) sampleSize = sizeof (float);

            int pointerSize = sizeof (char *);

            frameBuffer.insert (str,                            // name // 6
                                DeepSlice (type,                    // type // 7
                                (char *) (&data[i][0][0]
                                          - dataWindow.min.x
                                          - dataWindow.min.y * width),               // base // 8)
                                pointerSize * 1,          // xStride// 9
                                pointerSize * width,      // yStride// 10
                                sampleSize));             // sampleStride
	    channels_added++;
        }
    }
    
    
    if(channels_added==0)
    {
      cout << "skipping " <<flush;
      return;
    }
    for(int i = 0 ; i < fillChannels ; ++i )
    { 
            PixelType type  = IMF::FLOAT;
            int sampleSize = sizeof(float);            
            int pointerSize = sizeof (char *);
            stringstream ss;
            // generate channel names that aren't in file but (might) interleave with existing file
            ss << i << "fill";
            string str = ss.str();
               frameBuffer.insert (str,                            // name // 6
                                DeepSlice (type,                    // type // 7
                                (char *) (&data[i+channelCount][0][0]
                                          - dataWindow.min.x
                                          - dataWindow.min.y * width),               // base // 8)
                                pointerSize * 1,          // xStride// 9
                                pointerSize * width,      // yStride// 10
                                sampleSize));             // sampleStride
    }
    file.setFrameBuffer(frameBuffer);

    if (bulkRead)
    {
        cout << "bulk " << flush;
        file.readPixelSampleCounts(dataWindow.min.y, dataWindow.max.y);
        for (int i = 0; i < dataWindow.max.y - dataWindow.min.y + 1; i++)
        {
            for (int j = 0; j < width; j++)
                assert(localSampleCount[i][j] == sampleCount[i][j]);

            for (int j = 0; j < width; j++)
            {
                for (int k = 0; k < channelCount; k++)
                {
                    if(!randomChannels || read_channel[k]==1)
                    {
                                if (channelTypes[k] == 0)
                                    data[k][i][j] = new unsigned int[localSampleCount[i][j]];
                                if (channelTypes[k] == 1)
                                    data[k][i][j] = new half[localSampleCount[i][j]];
                                if (channelTypes[k] == 2)
                                    data[k][i][j] = new float[localSampleCount[i][j]];
                    }
                }
                for( int f = 0 ; f < fillChannels ; ++f )
                {
                       data[f+channelCount][i][j] = new float[localSampleCount[i][j]];
                }
            }
        }
        
        file.readPixels(dataWindow.min.y, dataWindow.max.y);
    }
    
    else
    {
        cout << "per-line " << flush;
        for (int i = 0; i < dataWindow.max.y - dataWindow.min.y + 1; i++)
        {
            int y = i + dataWindow.min.y;
            file.readPixelSampleCounts(y);

            for (int j = 0; j < width; j++)
                assert(localSampleCount[i][j] == sampleCount[i][j]);

            for (int j = 0; j < width; j++)
            {
                for (int k = 0; k < channelCount; k++)
                {
                    if( !randomChannels || read_channel[k]==1)
                    {
                                if (channelTypes[k] == 0)
                                    data[k][i][j] = new unsigned int[localSampleCount[i][j]];
                                if (channelTypes[k] == 1)
                                    data[k][i][j] = new half[localSampleCount[i][j]];
                                if (channelTypes[k] == 2)
                                    data[k][i][j] = new float[localSampleCount[i][j]];
                    }
                }
                for( int f = 0 ; f < fillChannels ; ++f )
                {
                       data[f+channelCount][i][j] = new float[localSampleCount[i][j]];
                }
            }

            file.readPixels(y);
	    
        }
    }

    for (int i = 0; i < height; i++)
        for (int j = 0; j < width; j++)
            for (int k = 0; k < channelCount; k++)
            {
                if( !randomChannels || read_channel[k]==1 )
                {
                    for (unsigned int l = 0; l < sampleCount[i][j]; l++)
                    {
                        if (channelTypes[k] == 0)
                        {
                            unsigned int* value = (unsigned int*)(data[k][i][j]);
                            if (value[l] != static_cast<unsigned int>(i * width + j) % 2049)
                                cout << j << ", " << i << " error, should be "
                                     << (i * width + j) % 2049 << ", is " << value[l]
                                     << endl << flush;
                            assert (value[l] == static_cast<unsigned int>(i * width + j) % 2049);
                        }
                        if (channelTypes[k] == 1)
                        {
                            half* value = (half*)(data[k][i][j]);
                            if (value[l] != (i * width + j) % 2049)
                                cout << j << ", " << i << " error, should be "
                                     << (i * width + j) % 2049 << ", is " << value[l]
                                     << endl << flush;
                            assert (((half*)(data[k][i][j]))[l] == (i * width + j) % 2049);
                        }
                        if (channelTypes[k] == 2)
                        {
                            float* value = (float*)(data[k][i][j]);
                            if (value[l] != (i * width + j) % 2049)
                                cout << j << ", " << i << " error, should be "
                                     << (i * width + j) % 2049 << ", is " << value[l]
                                     << endl << flush;
                            assert (((float*)(data[k][i][j]))[l] == (i * width + j) % 2049);
                        }
                    }
                }
            }

    for (int i = 0; i < height; i++)
        for (int j = 0; j < width; j++)
        {
            for (int k = 0; k < channelCount; k++)
            {
                if( !randomChannels || read_channel[k]==1 )
                {
                    if (channelTypes[k] == 0)
                        delete[] (unsigned int*) data[k][i][j];
                    if (channelTypes[k] == 1)
                        delete[] (half*) data[k][i][j];
                    if (channelTypes[k] == 2)
                        delete[] (float*) data[k][i][j];
                }
            }
            for( int f = 0 ; f < fillChannels ; ++f )
            {
                 delete[] (float*) data[f+channelCount][i][j];
            }
       }
}